

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<253UL> * __thiscall GF2::WW<253ul>::SetHi<126ul>(WW<253UL> *this,WW<126UL> *w)

{
  long *in_RSI;
  WW<253UL> *in_RDI;
  size_t pos_1;
  size_t pos;
  size_t offset;
  size_t start;
  ulong local_28;
  
  in_RDI->_words[1] = in_RDI->_words[1] << 1;
  in_RDI->_words[1] = in_RDI->_words[1] >> 1;
  in_RDI->_words[1] = *in_RSI << 0x3f | in_RDI->_words[1];
  for (local_28 = 1; local_28 < 2; local_28 = local_28 + 1) {
    in_RDI->_words[local_28 + 1] = in_RSI[local_28] << 0x3f | (ulong)in_RSI[local_28 - 1] >> 1;
  }
  if (local_28 + 1 < 4) {
    in_RDI->_words[local_28 + 1] = (ulong)in_RSI[local_28 - 1] >> 1;
  }
  WW<253UL>::Trim(in_RDI);
  return in_RDI;
}

Assistant:

WW& SetHi(const WW<_m>& w)
	{
		static_assert(_m <= _n);
		// первое слово, в котором начинается правая часть
		size_t start = (_n - _m) / B_PER_W;
		// правая часть начинается посередине слова (со смещением offset)?
		if (size_t offset = (_n - _m) % B_PER_W)
		{
			// очистить старшие B_PER_W - offset битов _words[start]
			(_words[start] <<= B_PER_W - offset) >>= B_PER_W - offset;
			// и записать в них младшие биты первого слова w
			_words[start] |= w._words[0] << offset;
			// далее объединять биты двух последовательных слов w
			size_t pos;
			for (pos = 1; pos < w._wcount; ++pos)
				_words[pos + start] = (w._words[pos] << offset) |
					(w._words[pos - 1] >> (B_PER_W - offset));
			// обработать остатки
			if (pos + start < _wcount)
				_words[pos + start] = w._words[pos - 1] >> (B_PER_W - offset);
		}
		else 
			for (size_t pos = 0; pos < w._wcount; ++pos)
				_words[pos + start] = w._words[pos];
		Trim();
		return *this;
	}